

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O2

void __thiscall interfaces_tests::findCommonAncestor::test_method(findCommonAncestor *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  CKey *this_00;
  pointer ppCVar1;
  Chain *pCVar2;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar3;
  Chainstate *pCVar4;
  Chainstate *this_01;
  CBlockIndex *pCVar5;
  char *pcVar6;
  iterator pvVar7;
  iterator pvVar8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar9;
  int *piVar10;
  uint256 *puVar11;
  int iVar12;
  long in_FS_OFFSET;
  bool bVar13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  check_type cVar14;
  CBlockIndex *local_490;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 local_3b8 [16];
  undefined1 *local_3a8;
  char **local_3a0;
  assertion_result local_398;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  int orig_height;
  int fork_height;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> local_238;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 uStack_200;
  undefined7 local_1ff;
  undefined1 uStack_1f8;
  undefined7 uStack_1f7;
  undefined1 uStack_1f0;
  undefined7 uStack_1ef;
  undefined1 local_1e8 [16];
  shared_count sStack_1d8;
  uchar auStack_1d0 [8];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined1 *puStack_1b0;
  undefined1 local_1a8 [32];
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined1 uStack_170;
  undefined7 uStack_16f;
  undefined1 local_168;
  undefined7 uStack_167;
  undefined1 uStack_160;
  undefined7 uStack_15f;
  BlockValidationState state;
  uint256 orig_hash;
  uint256 active_hash;
  uint256 fork_hash;
  CBlock local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  val = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x65,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x65,"operator()","m_node.chainman");
  pvVar7 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&state,&cs_main,
             "inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp\", 101, __func__, \"m_node.chainman\")->GetMutex()"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x65,false);
  pcVar6 = "m_node.chainman";
  puVar3 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (val,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
                      ,0x65,"operator()","m_node.chainman");
  pCVar4 = ChainstateManager::ActiveChainstate
                     ((puVar3->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&state);
  ppCVar1 = (pCVar4->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (pCVar4->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_490 = (CBlockIndex *)0x0;
  }
  else {
    local_490 = ppCVar1[-1];
  }
  iVar12 = 10;
  while (bVar13 = iVar12 != 0, iVar12 = iVar12 + -1, bVar13) {
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
           _M_allocated_capacity & 0xffffffffffffff00;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
    this_01 = ChainstateManager::ActiveChainstate
                        ((val->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar1 = (pCVar4->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar1 ==
        (pCVar4->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar5 = (CBlockIndex *)0x0;
    }
    else {
      pCVar5 = ppCVar1[-1];
    }
    Chainstate::InvalidateBlock
              (this_01,(BlockValidationState *)&state.super_ValidationState<BlockValidationResult>,
               pCVar5);
    ValidationState<BlockValidationResult>::~ValidationState
              (&state.super_ValidationState<BlockValidationResult>);
  }
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar7;
  msg.m_begin = pcVar6;
  file.m_end = (iterator)0x6b;
  file.m_begin = (iterator)&local_248;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_258,msg);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01139f30;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_260 = "";
  local_1a8._0_4_ =
       (int)((ulong)((long)(pCVar4->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(pCVar4->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -1;
  local_238.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_238.
                         super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,local_490->nHeight + -10);
  pvVar7 = (iterator)0x2;
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1a8;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&state,&local_268,0x6b,1,2,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1a8,"active.Height()",
             &local_238,"orig_tip->nHeight - 10");
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).coinbaseKey;
  CKey::MakeNewKey(this_00,true);
  iVar12 = 0x14;
  while (bVar13 = iVar12 != 0, iVar12 = iVar12 + -1, bVar13) {
    local_238.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CKey::GetPubKey((CPubKey *)&state,this_00);
    GetScriptForRawPubKey((CScript *)local_1a8,(CPubKey *)&state);
    pvVar7 = (iterator)0x0;
    TestChain100Setup::CreateAndProcessBlock
              (&local_a8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_238,(CScript *)local_1a8,
               (Chainstate *)0x0);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_a8.vtx);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1a8);
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector(&local_238);
  }
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)ppVar9;
  msg_00.m_begin = pvVar7;
  file_00.m_end = (iterator)0x70;
  file_00.m_begin = (iterator)&local_278;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_288,
             msg_00);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01139f30;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_290 = "";
  pvVar7 = local_1a8;
  local_1a8._0_4_ =
       (int)((ulong)((long)(pCVar4->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(pCVar4->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -1;
  local_238.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_238.
                         super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,local_490->nHeight + 10);
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&state,&local_298,0x70,1,2,pvVar7,"active.Height()",&local_238,"orig_tip->nHeight + 10"
            );
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar8;
  file_01.m_end = (iterator)0x74;
  file_01.m_begin = (iterator)&local_2b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2c0,
             msg_01);
  pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  CBlockIndex::GetBlockHash(&active_hash,local_490);
  CBlockIndex::GetBlockHash
            (&orig_hash,
             (pCVar4->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[8] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._9_7_ = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_allocated_capacity.
  _1_7_ = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._8_8_ = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p = (pointer)0x0
  ;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&fork_height;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &fork_hash;
  local_1a8._0_8_ = (char *)0x0;
  local_168 = 0;
  uStack_167 = 0;
  uStack_160 = 0;
  uStack_15f = 0;
  local_178 = 0;
  uStack_170 = 0;
  uStack_16f = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_1a8._16_8_ = 0;
  local_1a8._24_8_ = 0;
  local_1a8._8_8_ = &orig_height;
  uStack_1f8 = 0;
  uStack_1f7 = 0;
  uStack_1f0 = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  local_1ff = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_238.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_220 = 0;
  local_238.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _cVar14 = 0x35c08e;
  iVar12 = (*pCVar2->_vptr_Chain[0xe])(pCVar2,&active_hash,&orig_hash,&state,local_1a8);
  local_1e8[0] = (class_property<bool>)SUB41(iVar12,0);
  local_1e8._8_8_ = (element_type *)0x0;
  sStack_1d8.pi_ = (sp_counted_base *)0x0;
  puStack_1b0 = local_3b8;
  local_3b8._0_8_ =
       "chain->findCommonAncestor(orig_tip->GetBlockHash(), active.Tip()->GetBlockHash(), FoundBlock().height(fork_height).hash(fork_hash), FoundBlock().height(orig_height))"
  ;
  local_3b8._8_8_ = "";
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_2c8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)local_1c8,1,0,WARN,_cVar14,
             (size_t)&local_2d0,0x74);
  boost::detail::shared_count::~shared_count(&sStack_1d8);
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  file_02.m_end = (iterator)0x75;
  file_02.m_begin = (iterator)&local_2e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2f0,
             msg_02);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01139f30;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_2f8 = "";
  pvVar7 = (iterator)0x2;
  piVar10 = &orig_height;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&state,&local_300,0x75,1,2,piVar10,"orig_height",&local_490->nHeight,
             "orig_tip->nHeight");
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)piVar10;
  msg_03.m_begin = pvVar7;
  file_03.m_end = (iterator)0x76;
  file_03.m_begin = (iterator)&local_310;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_320,
             msg_03);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01139f30;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_328 = "";
  local_1a8._0_4_ = local_490->nHeight + -10;
  pvVar7 = (iterator)0x2;
  piVar10 = &fork_height;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&state,&local_330,0x76,1,2,piVar10,"fork_height",(uint256 *)local_1a8,
             "orig_tip->nHeight - 10");
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)piVar10;
  msg_04.m_begin = pvVar7;
  file_04.m_end = (iterator)0x77;
  file_04.m_begin = (iterator)&local_340;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_350,
             msg_04);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01139f30;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_358 = "";
  pCVar5 = CChain::operator[](&pCVar4->m_chain,fork_height);
  CBlockIndex::GetBlockHash((uint256 *)local_1a8,pCVar5);
  pvVar7 = (iterator)0x2;
  puVar11 = &fork_hash;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&state,&local_360,0x77,1,2,puVar11,"fork_hash",(uint256 *)local_1a8,
             "active[fork_height]->GetBlockHash()");
  active_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)puVar11;
  msg_05.m_begin = pvVar7;
  file_05.m_end = (iterator)0x7a;
  file_05.m_begin = (iterator)&local_370;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_380,
             msg_05);
  pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  CBlockIndex::GetBlockHash
            ((uint256 *)local_1c8,
             (pCVar4->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  sStack_1d8.pi_ = (sp_counted_base *)0x0;
  auStack_1d0[0] = '\0';
  auStack_1d0[1] = '\0';
  auStack_1d0[2] = '\0';
  auStack_1d0[3] = '\0';
  auStack_1d0[4] = '\0';
  auStack_1d0[5] = '\0';
  auStack_1d0[6] = '\0';
  auStack_1d0[7] = '\0';
  local_1e8._0_8_ = 0;
  local_1e8._8_8_ = (element_type *)0x0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[8] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._9_7_ = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_allocated_capacity.
  _1_7_ = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._8_8_ = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p = (pointer)0x0
  ;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       0;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p = (pointer)0x0
  ;
  uStack_170 = 0;
  uStack_16f = 0;
  local_168 = 0;
  uStack_167 = 0;
  uStack_180 = 0;
  local_178 = 0;
  local_1a8._24_8_ = 0;
  local_188 = 0;
  local_1a8._8_8_ = 0;
  local_1a8._16_8_ = 0;
  uStack_160 = 0;
  uStack_15f = 0;
  local_1a8._0_8_ = &active_hash;
  uStack_1f8 = 0;
  uStack_1f7 = 0;
  uStack_1f0 = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  local_1ff = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_238.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_220 = 0;
  local_238.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _cVar14 = 0x35c41c;
  iVar12 = (*pCVar2->_vptr_Chain[0xe])(pCVar2,(uint256 *)local_1c8);
  local_398.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)iVar12 ^ 1);
  local_398.m_message.px = (element_type *)0x0;
  local_398.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3c8 = 
  "!chain->findCommonAncestor(active.Tip()->GetBlockHash(), {}, {}, FoundBlock().hash(active_hash), {})"
  ;
  local_3c0 = "";
  local_3b8._8_8_ = local_3b8._8_8_ & 0xffffffffffffff00;
  local_3b8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_3a8 = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_3d0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_3a0 = &local_3c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_398,(lazy_ostream *)local_3b8,1,0,WARN,_cVar14,(size_t)&local_3d8,0x7a);
  boost::detail::shared_count::~shared_count(&local_398.m_message.pn);
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  file_06.m_end = (iterator)0x7b;
  file_06.m_begin = (iterator)&local_3e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3f8,
             msg_06);
  pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_1b8._0_1_ = '\0';
  local_1b8._1_1_ = '\0';
  local_1b8._2_1_ = '\0';
  local_1b8._3_1_ = '\0';
  local_1b8._4_1_ = '\0';
  local_1b8._5_1_ = '\0';
  local_1b8._6_1_ = '\0';
  local_1b8._7_1_ = '\0';
  puStack_1b0 = (undefined1 *)0x0;
  local_1c8._0_8_ = (_func_int **)0x0;
  local_1c8._8_8_ = 0;
  CBlockIndex::GetBlockHash((uint256 *)local_1e8,local_490);
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[8] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._9_7_ = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_allocated_capacity.
  _1_7_ = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._8_8_ = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p = (pointer)0x0
  ;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       0;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p = (pointer)0x0
  ;
  local_168 = 0;
  uStack_167 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  uStack_16f = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_1a8._16_8_ = 0;
  local_1a8._24_8_ = 0;
  local_1a8._0_8_ = (char *)0x0;
  local_1a8._8_8_ = 0;
  uStack_200 = 0;
  local_1ff = 0;
  uStack_1f8 = 0;
  uStack_1f7 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  uStack_1f0 = 0;
  uStack_1ef = 0;
  uStack_220 = 0;
  local_218 = 0;
  local_238.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&orig_hash;
  _cVar14 = 0x35c5a0;
  iVar12 = (*pCVar2->_vptr_Chain[0xe])
                     (pCVar2,local_1c8,(uint256 *)local_1e8,&state,(uint256 *)local_1a8);
  local_398.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)iVar12 ^ 1);
  local_398.m_message.px = (element_type *)0x0;
  local_398.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3c8 = 
  "!chain->findCommonAncestor({}, orig_tip->GetBlockHash(), {}, {}, FoundBlock().hash(orig_hash))";
  local_3c0 = "";
  local_3b8._8_8_ = local_3b8._8_8_ & 0xffffffffffffff00;
  local_3b8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_3a8 = boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_400 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_3a0 = &local_3c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_398,(lazy_ostream *)local_3b8,1,0,WARN,_cVar14,(size_t)&local_408,0x7b);
  boost::detail::shared_count::~shared_count(&local_398.m_message.pn);
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  file_07.m_end = (iterator)0x7c;
  file_07.m_begin = (iterator)&local_418;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_428,
             msg_07);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01139f30;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_430 = "";
  CBlockIndex::GetBlockHash
            ((uint256 *)local_1a8,
             (pCVar4->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  pvVar7 = (iterator)0x2;
  puVar11 = &active_hash;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&state,&local_438,0x7c,1,2,puVar11,"active_hash",(uint256 *)local_1a8,
             "active.Tip()->GetBlockHash()");
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)puVar11;
  msg_08.m_begin = pvVar7;
  file_08.m_end = (iterator)0x7d;
  file_08.m_begin = (iterator)&local_448;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_458,
             msg_08);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01139f30;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_460 = "";
  CBlockIndex::GetBlockHash((uint256 *)local_1a8,local_490);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&state,&local_468,0x7d,1,2,&orig_hash,"orig_hash",(uint256 *)local_1a8,
             "orig_tip->GetBlockHash()");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(findCommonAncestor)
{
    auto& chain = m_node.chain;
    const CChain& active{*WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return &Assert(m_node.chainman)->ActiveChain())};
    auto* orig_tip = active.Tip();
    for (int i = 0; i < 10; ++i) {
        BlockValidationState state;
        m_node.chainman->ActiveChainstate().InvalidateBlock(state, active.Tip());
    }
    BOOST_CHECK_EQUAL(active.Height(), orig_tip->nHeight - 10);
    coinbaseKey.MakeNewKey(true);
    for (int i = 0; i < 20; ++i) {
        CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
    }
    BOOST_CHECK_EQUAL(active.Height(), orig_tip->nHeight + 10);
    uint256 fork_hash;
    int fork_height;
    int orig_height;
    BOOST_CHECK(chain->findCommonAncestor(orig_tip->GetBlockHash(), active.Tip()->GetBlockHash(), FoundBlock().height(fork_height).hash(fork_hash), FoundBlock().height(orig_height)));
    BOOST_CHECK_EQUAL(orig_height, orig_tip->nHeight);
    BOOST_CHECK_EQUAL(fork_height, orig_tip->nHeight - 10);
    BOOST_CHECK_EQUAL(fork_hash, active[fork_height]->GetBlockHash());

    uint256 active_hash, orig_hash;
    BOOST_CHECK(!chain->findCommonAncestor(active.Tip()->GetBlockHash(), {}, {}, FoundBlock().hash(active_hash), {}));
    BOOST_CHECK(!chain->findCommonAncestor({}, orig_tip->GetBlockHash(), {}, {}, FoundBlock().hash(orig_hash)));
    BOOST_CHECK_EQUAL(active_hash, active.Tip()->GetBlockHash());
    BOOST_CHECK_EQUAL(orig_hash, orig_tip->GetBlockHash());
}